

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventplayer.cxx
# Opt level: O0

void __thiscall
EventPlayer::EventPlayer
          (EventPlayer *this,Time *time,string *filename,double resolution,EventFileType fileType)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  char *pcVar3;
  long *plVar4;
  undefined1 auVar5 [16];
  double local_4d8;
  double local_4d0;
  double a_1;
  fstream stream_1;
  double local_2b8;
  byte local_2a9;
  undefined8 uStack_2a8;
  bool success;
  unsigned_long a;
  fstream stream;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  EventFileType local_2c;
  double dStack_28;
  EventFileType fileType_local;
  double resolution_local;
  string *filename_local;
  Time *time_local;
  EventPlayer *this_local;
  
  local_2c = fileType;
  dStack_28 = resolution;
  resolution_local = (double)filename;
  filename_local = (string *)time;
  time_local = (Time *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"Event Generator",&local_89);
  StochasticEventGenerator::StochasticEventGenerator
            (&this->super_StochasticEventGenerator,time,&local_50,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Parametric._vptr_Parametric = (_func_int **)&PTR__EventPlayer_0018eea8;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_TimeDependent._vptr_TimeDependent = (_func_int **)&PTR__EventPlayer_0018ef40;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Physical._vptr_Physical = (_func_int **)&PTR__EventPlayer_0018ef88;
  std::__cxx11::string::string((string *)&this->playerFileName);
  std::vector<double,_std::allocator<double>_>::vector(&this->playerBuffer);
  if (local_2c == BINARY8LE) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    _Var2 = std::operator|(_S_in,_S_bin);
    std::fstream::fstream(&a,pcVar3,_Var2);
    local_2a9 = 1;
    while ((local_2a9 & 1) != 0) {
      plVar4 = (long *)std::istream::read((char *)&a,(long)&stack0xfffffffffffffd58);
      local_2a9 = std::ios::operator_cast_to_bool
                            ((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
      if ((bool)local_2a9) {
        auVar5._8_4_ = (int)((ulong)uStack_2a8 >> 0x20);
        auVar5._0_8_ = uStack_2a8;
        auVar5._12_4_ = 0x45300000;
        local_2b8 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uStack_2a8) - 4503599627370496.0)) * dStack_28
        ;
        std::vector<double,_std::allocator<double>_>::push_back(&this->playerBuffer,&local_2b8);
      }
    }
    std::fstream::~fstream(&a);
  }
  else if (local_2c == ASCII) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::fstream::fstream(&a_1,pcVar3,_S_in);
    while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
      std::istream::operator>>((istream *)&a_1,&local_4d0);
      local_4d8 = local_4d0 * dStack_28;
      std::vector<double,_std::allocator<double>_>::push_back(&this->playerBuffer,&local_4d8);
    }
    std::fstream::~fstream(&a_1);
  }
  return;
}

Assistant:

EventPlayer::EventPlayer( Time *time, string filename, double resolution, EventFileType fileType)
	: StochasticEventGenerator(time)
{
	if (fileType==BINARY8LE) {
		
		// open file
		fstream stream( filename.c_str(), ios::in | ios::binary);
		
		// read file contents into buffer
		unsigned long int a;
		bool success = true;
		while (success) {
			success = (bool) stream.read((char *)&a, 8);
			if (success)
				playerBuffer.push_back(double(a) * resolution);
		}
	}
	else if (fileType==ASCII) {

		// open file
		fstream stream( filename.c_str(), ios::in );
		
		// read file contents into buffer
		double a;
		while (!stream.eof()) {
			stream >> a;
			playerBuffer.push_back(a * resolution);
		}
	}
}